

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O1

void __thiscall
spdlog::details::file_helper::file_helper(file_helper *this,file_event_handlers *event_handlers)

{
  this->open_tries_ = 5;
  this->open_interval_ = 10;
  this->fd_ = (FILE *)0x0;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  file_event_handlers::file_event_handlers(&this->event_handlers_,event_handlers);
  return;
}

Assistant:

SPDLOG_INLINE file_helper::file_helper(const file_event_handlers &event_handlers)
    : event_handlers_(event_handlers)
{}